

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

void nvpair_free(nvpair_t *nvp)

{
  ulong local_18;
  size_t i;
  nvpair_t *nvp_local;
  
  if (nvp == (nvpair_t *)0x0) {
    __assert_fail("(nvp) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x7db,"void nvpair_free(nvpair_t *)");
  }
  if (nvp->nvp_magic != 0x6e7670) {
    __assert_fail("(nvp)->nvp_magic == 0x6e7670",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x7db,"void nvpair_free(nvpair_t *)");
  }
  if (nvp->nvp_list != (nvlist_t *)0x0) {
    __assert_fail("nvp->nvp_list == ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x7dc,"void nvpair_free(nvpair_t *)");
  }
  nvp->nvp_magic = 0;
  switch(nvp->nvp_type) {
  case 4:
    free((void *)nvp->nvp_data);
    break;
  case 5:
    nvlist_destroy((nvlist_t *)nvp->nvp_data);
    break;
  case 6:
    close((int)nvp->nvp_data);
    break;
  case 7:
    free((void *)nvp->nvp_data);
    break;
  case 8:
    free((void *)nvp->nvp_data);
    break;
  case 9:
    free((void *)nvp->nvp_data);
    break;
  case 10:
    for (local_18 = 0; local_18 < nvp->nvp_nitems; local_18 = local_18 + 1) {
      free(*(void **)(nvp->nvp_data + local_18 * 8));
    }
    free((void *)nvp->nvp_data);
    break;
  case 0xb:
    for (local_18 = 0; local_18 < nvp->nvp_nitems; local_18 = local_18 + 1) {
      nvlist_destroy(*(nvlist_t **)(nvp->nvp_data + local_18 * 8));
    }
    free((void *)nvp->nvp_data);
    break;
  case 0xc:
    for (local_18 = 0; local_18 < nvp->nvp_nitems; local_18 = local_18 + 1) {
      close(*(int *)(nvp->nvp_data + local_18 * 4));
    }
    free((void *)nvp->nvp_data);
  }
  free(nvp);
  return;
}

Assistant:

void
nvpair_free(nvpair_t *nvp)
{
	size_t i;

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_list == NULL);

	nvp->nvp_magic = 0;
	switch (nvp->nvp_type) {
	case NV_TYPE_DESCRIPTOR:
		close((int)nvp->nvp_data);
		break;
	case NV_TYPE_DESCRIPTOR_ARRAY:
		for (i = 0; i < nvp->nvp_nitems; i++)
			close(((int *)(intptr_t)nvp->nvp_data)[i]);
		nv_free((int *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_NVLIST:
		nvlist_destroy((nvlist_t *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_STRING:
		nv_free((char *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_BINARY:
		nv_free((void *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_NVLIST_ARRAY:
		for (i = 0; i < nvp->nvp_nitems; i++) {
			nvlist_destroy(
			    ((nvlist_t **)(intptr_t)nvp->nvp_data)[i]);
		}
		nv_free(((nvlist_t **)(intptr_t)nvp->nvp_data));
		break;
	case NV_TYPE_NUMBER_ARRAY:
		nv_free((uint64_t *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_BOOL_ARRAY:
		nv_free((bool *)(intptr_t)nvp->nvp_data);
		break;
	case NV_TYPE_STRING_ARRAY:
		for (i = 0; i < nvp->nvp_nitems; i++)
			nv_free(((char **)(intptr_t)nvp->nvp_data)[i]);
		nv_free((char **)(intptr_t)nvp->nvp_data);
		break;
	}
	nv_free(nvp);
}